

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

void __thiscall
llvm::detail::DoubleAPFloat::toString
          (DoubleAPFloat *this,SmallVectorImpl<char> *Str,uint FormatPrecision,uint FormatMaxPadding
          ,bool TruncateZero)

{
  DoubleAPFloat local_60;
  APFloat local_50;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    bitcastToAPInt(&local_60);
    IEEEFloat::IEEEFloat
              (&local_50.U.IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)&local_60);
    APFloat::toString(&local_50,Str,FormatPrecision,FormatMaxPadding,TruncateZero);
    APFloat::Storage::~Storage((Storage *)&local_50.U.IEEE);
    APInt::~APInt((APInt *)&local_60);
    return;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x111d,
                "void llvm::detail::DoubleAPFloat::toString(SmallVectorImpl<char> &, unsigned int, unsigned int, bool) const"
               );
}

Assistant:

void DoubleAPFloat::toString(SmallVectorImpl<char> &Str,
                             unsigned FormatPrecision,
                             unsigned FormatMaxPadding,
                             bool TruncateZero) const {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat(semPPCDoubleDoubleLegacy, bitcastToAPInt())
      .toString(Str, FormatPrecision, FormatMaxPadding, TruncateZero);
}